

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O1

unsigned_long elf_hash(char *_name)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  uchar *name;
  byte *pbVar4;
  
  bVar2 = *_name;
  if (bVar2 != 0) {
    pbVar4 = (byte *)(_name + 1);
    uVar3 = 0;
    do {
      uVar3 = (ulong)bVar2 + uVar3 * 0x10;
      uVar1 = (uint)uVar3 & 0xf0000000;
      uVar3 = ~(ulong)uVar1 & (uVar1 >> 0x18 ^ uVar3);
      bVar2 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (bVar2 != 0);
    return uVar3;
  }
  return 0;
}

Assistant:

unsigned long elf_hash(const char *_name)
/* calculate a hash code as used in ELF objects */
{
  const unsigned char *name=(const unsigned char *)_name;
  unsigned long h=0,g;

  while (*name) {
    h = (h << 4) + *name++;
    if (g = h & 0xf0000000)
      h ^= g >> 24;
    h &= ~g;
  }
  return h;
}